

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

SockAddr *
name_lookup(char *host,int port,char **canonicalname,Conf *conf,int addressfamily,LogContext *logctx
           ,char *reason)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  SockAddr *pSVar4;
  Conf *conf_00;
  char *pcVar5;
  
  conf_00 = conf;
  iVar2 = conf_get_int(conf,0xd);
  if (iVar2 == 0) goto LAB_00143544;
  iVar2 = conf_get_int(conf,0xb);
  if (iVar2 != 0) {
    iVar2 = conf_get_int(conf,0xb);
    if (iVar2 != 2) goto LAB_00143544;
    iVar2 = conf_get_int(conf,0xd);
    if (iVar2 == 1) goto LAB_00143544;
  }
  _Var1 = proxy_for_destination((SockAddr *)0x0,host,(int)conf,conf_00);
  if (_Var1) {
    if (logctx != (LogContext *)0x0) {
      logeventf(logctx,"Leaving host lookup to proxy of \"%s\" (for %s)",host,reason);
    }
    pcVar3 = dupstr(host);
    *canonicalname = pcVar3;
    pSVar4 = sk_nonamelookup(host);
    return pSVar4;
  }
LAB_00143544:
  if (logctx != (LogContext *)0x0) {
    pcVar3 = anon_var_dwarf_34f89 + 10;
    if (addressfamily == 2) {
      pcVar3 = " (IPv6)";
    }
    pcVar5 = " (IPv4)";
    if (addressfamily != 1) {
      pcVar5 = pcVar3;
    }
    pcVar3 = dupprintf("Looking up host \"%s\"%s for %s",host,pcVar5,reason);
    logevent_and_free(logctx,pcVar3);
  }
  pSVar4 = sk_namelookup(host,canonicalname,addressfamily);
  return pSVar4;
}

Assistant:

SockAddr *name_lookup(const char *host, int port, char **canonicalname,
                     Conf *conf, int addressfamily, LogContext *logctx,
                     const char *reason)
{
    if (conf_get_int(conf, CONF_proxy_type) != PROXY_NONE &&
        do_proxy_dns(conf) &&
        proxy_for_destination(NULL, host, port, conf)) {

        if (logctx)
            logeventf(logctx, "Leaving host lookup to proxy of \"%s\""
                      " (for %s)", host, reason);

        *canonicalname = dupstr(host);
        return sk_nonamelookup(host);
    } else {
        if (logctx)
            logevent_and_free(
                logctx, dns_log_msg(host, addressfamily, reason));

        return sk_namelookup(host, canonicalname, addressfamily);
    }
}